

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::ComputeOutputDir(cmTarget *this,string *config,bool implib,string *out)

{
  size_type sVar1;
  cmMakefile *pcVar2;
  char *pcVar3;
  char *pcVar4;
  cmGlobalGenerator *pcVar5;
  string suffix;
  string configPropStr;
  string propertyNameStr;
  string conf;
  string targetTypeName;
  string configUpper;
  allocator local_109;
  string local_108;
  allocator local_e8 [32];
  char *local_c8;
  long local_c0;
  char *local_a8;
  long local_a0;
  string local_88;
  string local_68 [32];
  string local_48;
  
  std::__cxx11::string::string((string *)&local_88,(string *)config);
  pcVar3 = GetOutputTargetType(this,implib);
  std::__cxx11::string::string(local_68,pcVar3,(allocator *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,local_68);
  if (local_a0 == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_a8);
    pcVar3 = local_a8;
  }
  cmsys::SystemTools::UpperCase(&local_48,&local_88);
  std::__cxx11::string::string((string *)&local_c8,local_68);
  if (local_c0 == 0) {
    local_c8 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_c8);
    std::__cxx11::string::append((string *)&local_c8);
  }
  std::__cxx11::string::string((string *)&local_108,local_c8,local_e8);
  pcVar4 = GetProperty(this,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_108,pcVar3,local_e8);
    pcVar3 = GetProperty(this,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    if (pcVar3 == (char *)0x0) {
      if (this->TargetTypeValue - STATIC_LIBRARY < 3) {
        pcVar2 = this->Makefile;
        std::__cxx11::string::string((string *)&local_108,"LIBRARY_OUTPUT_PATH",local_e8);
        cmMakefile::GetSafeDefinition(pcVar2,&local_108);
        std::__cxx11::string::assign((char *)out);
      }
      else {
        if (this->TargetTypeValue != EXECUTABLE) goto LAB_003854c1;
        pcVar2 = this->Makefile;
        std::__cxx11::string::string((string *)&local_108,"EXECUTABLE_OUTPUT_PATH",local_e8);
        cmMakefile::GetSafeDefinition(pcVar2,&local_108);
        std::__cxx11::string::assign((char *)out);
      }
      std::__cxx11::string::~string((string *)&local_108);
    }
    else {
      std::__cxx11::string::assign((char *)out);
    }
  }
  else {
    std::__cxx11::string::assign((char *)out);
    std::__cxx11::string::assign((char *)&local_88);
  }
LAB_003854c1:
  sVar1 = out->_M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::assign((char *)out);
  }
  pcVar3 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
  cmsys::SystemTools::CollapseFullPath(&local_108,out,pcVar3);
  std::__cxx11::string::operator=((string *)out,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  if (local_88._M_string_length != 0) {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string((string *)&local_108,"CMAKE_XCODE_EFFECTIVE_PLATFORMS",local_e8);
    pcVar3 = cmMakefile::GetDefinition(pcVar2,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    pcVar4 = "$(EFFECTIVE_PLATFORM_NAME)";
    if (pcVar3 == (char *)0x0) {
      pcVar4 = "";
    }
    if (sVar1 != 0) {
      pcVar4 = "";
    }
    std::__cxx11::string::string((string *)&local_108,pcVar4,local_e8);
    pcVar5 = cmMakefile::GetGlobalGenerator(this->Makefile);
    std::__cxx11::string::string((string *)local_e8,"/",&local_109);
    (*pcVar5->_vptr_cmGlobalGenerator[0xe])(pcVar5,local_e8,&local_88,&local_108,out);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return sVar1 == 0;
}

Assistant:

bool cmTarget::ComputeOutputDir(const std::string& config,
                                bool implib, std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(implib);
  const char* propertyName = 0;
  std::string propertyNameStr = targetTypeName;
  if(!propertyNameStr.empty())
    {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
    }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = 0;
  std::string configPropStr = targetTypeName;
  if(!configPropStr.empty())
    {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
    }

  // Select an output directory.
  if(const char* config_outdir = this->GetProperty(configProp))
    {
    // Use the user-specified per-configuration output directory.
    out = config_outdir;

    // Skip per-configuration subdirectory.
    conf = "";
    }
  else if(const char* outdir = this->GetProperty(propertyName))
    {
    // Use the user-specified output directory.
    out = outdir;
    }
  else if(this->GetType() == cmTarget::EXECUTABLE)
    {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
    }
  else if(this->GetType() == cmTarget::STATIC_LIBRARY ||
          this->GetType() == cmTarget::SHARED_LIBRARY ||
          this->GetType() == cmTarget::MODULE_LIBRARY)
    {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
    }
  if(out.empty())
    {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
    }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath
         (out, this->Makefile->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if(!conf.empty())
    {
    const char *platforms = this->Makefile->GetDefinition(
      "CMAKE_XCODE_EFFECTIVE_PLATFORMS");
    std::string suffix =
      usesDefaultOutputDir && platforms ? "$(EFFECTIVE_PLATFORM_NAME)" : "";
    this->Makefile->GetGlobalGenerator()->
      AppendDirectoryForConfig("/", conf, suffix, out);
    }

  return usesDefaultOutputDir;
}